

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

void fiobj_data_seek(FIOBJ io,intptr_t position)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (io == 0) {
    return;
  }
  sVar1 = fiobj_type_is(io,(fiobj_type_enum)position);
  if (sVar1 == 0) {
    return;
  }
  uVar4 = position;
  if (*(uint *)(io + 0x30) < 0xfffffffe) {
    *(undefined8 *)(io + 0x20) = 0;
    *(undefined8 *)(io + 0x28) = 0;
    lVar5 = 0x10;
    if (position != 0) {
      uVar2 = fiobj_data_get_fd_size(io);
      uVar3 = 0;
      if (0 < (long)uVar2) {
        uVar3 = uVar2;
      }
      if (position < 1) {
        uVar4 = 0;
        if ((ulong)-position <= uVar3) {
          uVar4 = uVar3 + position;
        }
      }
      else if ((long)uVar2 < position) {
        uVar4 = uVar3;
      }
      goto LAB_0013a35d;
    }
  }
  else {
    lVar5 = 0x28;
    if (position != 0) {
      if (position < 1) {
        uVar4 = 0;
        if ((ulong)-position <= *(ulong *)(io + 0x20)) {
          uVar4 = *(ulong *)(io + 0x20) + position;
        }
      }
      else if (*(ulong *)(io + 0x20) < (ulong)position) {
        uVar4 = *(ulong *)(io + 0x20);
      }
      goto LAB_0013a35d;
    }
  }
  uVar4 = 0;
LAB_0013a35d:
  *(ulong *)(io + lVar5) = uVar4;
  return;
}

Assistant:

void fiobj_data_seek(FIOBJ io, intptr_t position) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA))
    return;
  switch (obj2io(io)->fd) {
  case -1: /* fallthrough */
  case -2:
    /* String / Slice code */
    if (position == 0) {
      obj2io(io)->pos = 0;
      return;
    }
    if (position > 0) {
      if ((uintptr_t)position > obj2io(io)->len)
        position = obj2io(io)->len;
      obj2io(io)->pos = position;
      return;
    }
    position = (0 - position);
    if ((uintptr_t)position > obj2io(io)->len)
      position = 0;
    else
      position = obj2io(io)->len - position;
    obj2io(io)->pos = position;
    return;
    break;
  default:
    /* File code */
    obj2io(io)->pos = 0;
    obj2io(io)->len = 0;

    if (position == 0) {
      obj2io(io)->source.fpos = 0;
      return;
    }
    int64_t len = fiobj_data_get_fd_size(io);
    if (len < 0)
      len = 0;
    if (position > 0) {
      if (position > len)
        position = len;

      obj2io(io)->source.fpos = position;
      return;
    }
    position = (0 - position);
    if (position > len)
      position = 0;
    else
      position = len - position;
    obj2io(io)->source.fpos = position;
    return;
  }
}